

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O3

void __thiscall
xray_re::xr_ogf_v3::partition_io::import
          (partition_io *this,xr_reader *r,xr_bone_vec *all_bones,int version)

{
  ushort *puVar1;
  uint *puVar2;
  pointer ppxVar3;
  xr_bone *pxVar4;
  size_t __n;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  string name;
  string local_50;
  
  xr_reader::r_sz(r,&(this->super_xr_partition).m_name);
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  uVar6 = (ulong)*puVar1;
  if (uVar6 != 0) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      if (version == 3) {
        xr_reader::r_sz(r,&local_50);
        puVar2 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        uVar7 = (ulong)*puVar2;
        ppxVar3 = (all_bones->
                  super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(all_bones->
                          super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppxVar3 >> 3) <= uVar7
           ) {
LAB_00181732:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        pxVar4 = ppxVar3[uVar7];
        __n = (pxVar4->m_name)._M_string_length;
        if (__n != local_50._M_string_length) {
LAB_00181740:
          __assert_fail("all_bones.at(r.r_u32())->name() == name",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                        ,0x150,
                        "void xray_re::xr_ogf_v3::partition_io::import(xr_reader &, xr_bone_vec &, int)"
                       );
        }
        if (__n != 0) {
          iVar5 = bcmp((pxVar4->m_name)._M_dataplus._M_p,local_50._M_dataplus._M_p,__n);
          if (iVar5 != 0) goto LAB_00181740;
        }
      }
      else if (version == 2) {
        xr_reader::r_sz(r,&local_50);
      }
      else if (version == 1) {
        puVar2 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        if ((ulong)((long)(all_bones->
                          super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(all_bones->
                          super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)*puVar2)
        goto LAB_00181732;
        std::__cxx11::string::_M_assign((string *)&local_50);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_xr_partition).m_bones,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

inline void xr_ogf_v3::partition_io::import(xr_reader& r, xr_bone_vec& all_bones, int version)
{
	r.r_sz(m_name);
	for (uint_fast32_t n = r.r_u16(); n; --n)
	{
		std::string name;
		switch (version)
		{
		case 1:
			name =  all_bones.at(r.r_u32())->name();
			break;
		case 2:
			r.r_sz(name);
			break;
		case 3:
			r.r_sz(name);
			xr_assert(all_bones.at(r.r_u32())->name() == name);
		}
		m_bones.push_back(name);
	}
}